

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

char * ImStrchrRange(char *str,char *str_end,char c)

{
  if (str < str_end) {
    do {
      if (*str == c) {
        return str;
      }
      str = str + 1;
    } while (str != str_end);
  }
  return (char *)0x0;
}

Assistant:

const char* ImStrchrRange(const char* str, const char* str_end, char c)
{
    for ( ; str < str_end; str++)
        if (*str == c)
            return str;
    return NULL;
}